

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool duckdb_snappy::Uncompress(Source *compressed,Sink *uncompressed)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  long *in_RSI;
  Source *in_RDI;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> writer_1;
  SnappySinkAllocator allocator;
  bool result;
  SnappyArrayWriter writer;
  size_t compressed_len;
  char *buf;
  size_t allocated_size;
  char c;
  uint32_t uncompressed_len;
  SnappyDecompressor decompressor;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *in_stack_fffffffffffffe90;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *in_stack_fffffffffffffe98;
  char *pcVar4;
  SnappyDecompressor *in_stack_fffffffffffffea0;
  uint32_t *in_stack_fffffffffffffeb0;
  SnappyDecompressor *in_stack_fffffffffffffeb8;
  SnappyArrayWriter local_a0;
  undefined8 local_80;
  char *local_78;
  ulong local_70;
  undefined1 local_61;
  undefined4 local_60;
  uint local_4c;
  SnappyDecompressor local_48;
  long *local_18;
  Source *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  SnappyDecompressor::SnappyDecompressor(&local_48,in_RDI);
  local_4c = 0;
  bVar1 = SnappyDecompressor::ReadUncompressedLength
                    (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  if (bVar1) {
    local_78 = (char *)(**(code **)(*local_18 + 0x28))(local_18,1,local_4c,&local_61,1,&local_70);
    iVar2 = (*local_10->_vptr_Source[2])();
    local_80 = CONCAT44(extraout_var,iVar2);
    if (local_70 < local_4c) {
      SnappySinkAllocator::SnappySinkAllocator
                (&in_stack_fffffffffffffe90->allocator_,
                 (Sink *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SnappyScatteredWriter
                (in_stack_fffffffffffffe90,
                 (SnappySinkAllocator *)
                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      local_1 = InternalUncompressAllTags<duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>>
                          (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                           (uint32_t)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                           (uint32_t)in_stack_fffffffffffffe90);
      local_60 = 1;
      SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::~SnappyScatteredWriter
                (in_stack_fffffffffffffe90);
      SnappySinkAllocator::~SnappySinkAllocator((SnappySinkAllocator *)0x23321d8);
    }
    else {
      SnappyArrayWriter::SnappyArrayWriter(&local_a0,local_78);
      bVar1 = InternalUncompressAllTags<duckdb_snappy::SnappyArrayWriter>
                        (in_stack_fffffffffffffea0,(SnappyArrayWriter *)in_stack_fffffffffffffe98,
                         (uint32_t)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffe90);
      pcVar4 = local_78;
      sVar3 = SnappyArrayWriter::Produced(&local_a0);
      (**(code **)(*local_18 + 0x10))(local_18,pcVar4,sVar3);
      local_60 = 1;
      local_1 = bVar1;
    }
  }
  else {
    local_1 = 0;
    local_60 = 1;
  }
  SnappyDecompressor::~SnappyDecompressor((SnappyDecompressor *)0x233222a);
  return (bool)(local_1 & 1);
}

Assistant:

bool Uncompress(Source* compressed, Sink* uncompressed) {
  // Read the uncompressed length from the front of the compressed input
  SnappyDecompressor decompressor(compressed);
  uint32_t uncompressed_len = 0;
  if (!decompressor.ReadUncompressedLength(&uncompressed_len)) {
    return false;
  }

  char c;
  size_t allocated_size;
  char* buf = uncompressed->GetAppendBufferVariable(1, uncompressed_len, &c, 1,
                                                    &allocated_size);

  const size_t compressed_len = compressed->Available();
  // If we can get a flat buffer, then use it, otherwise do block by block
  // uncompression
  if (allocated_size >= uncompressed_len) {
    SnappyArrayWriter writer(buf);
    bool result = InternalUncompressAllTags(&decompressor, &writer,
                                            compressed_len, uncompressed_len);
    uncompressed->Append(buf, writer.Produced());
    return result;
  } else {
    SnappySinkAllocator allocator(uncompressed);
    SnappyScatteredWriter<SnappySinkAllocator> writer(allocator);
    return InternalUncompressAllTags(&decompressor, &writer, compressed_len,
                                     uncompressed_len);
  }
}